

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O2

void __thiscall Network::~Network(Network *this)

{
  std::_Vector_base<Population_*,_std::allocator<Population_*>_>::~_Vector_base
            (&(this->populations).super__Vector_base<Population_*,_std::allocator<Population_*>_>);
  std::_Vector_base<Synapse_*,_std::allocator<Synapse_*>_>::~_Vector_base
            ((_Vector_base<Synapse_*,_std::allocator<Synapse_*>_> *)this);
  return;
}

Assistant:

Network::~Network()
{
    
}